

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O0

void __thiscall
PrimitiveDisplayer::drawRectangleOutline
          (PrimitiveDisplayer *this,Vec2d origin,Vec2d dimensions,Colour *colour)

{
  GLfloat *pGVar1;
  float fVar2;
  float fVar3;
  undefined4 local_48;
  undefined4 local_44;
  GLfloat vertices [8];
  Colour *colour_local;
  PrimitiveDisplayer *this_local;
  Vec2d dimensions_local;
  Vec2d origin_local;
  
  vertices._24_8_ = colour;
  this_local = (PrimitiveDisplayer *)dimensions;
  dimensions_local = origin;
  glPushMatrix();
  fVar2 = Vec2d::getX(&dimensions_local);
  fVar3 = Vec2d::getY(&dimensions_local);
  glTranslatef(fVar2,fVar3,0);
  pGVar1 = Colour::getColour3fv((Colour *)vertices._24_8_);
  glColor3fv(pGVar1);
  glShadeModel(0x1d00);
  local_48 = 0;
  local_44 = 0;
  vertices[0] = Vec2d::getX((Vec2d *)&this_local);
  vertices[1] = 0.0;
  vertices[2] = Vec2d::getX((Vec2d *)&this_local);
  vertices[3] = Vec2d::getY((Vec2d *)&this_local);
  vertices[4] = 0.0;
  vertices[5] = Vec2d::getY((Vec2d *)&this_local);
  glEnableClientState(0x8074);
  glVertexPointer(2,0x1406,0,&local_48);
  glLineWidth(0x40800000);
  glDrawArrays(2,0,4);
  glDisableClientState(0x8074);
  glPopMatrix();
  return;
}

Assistant:

void PrimitiveDisplayer::drawRectangleOutline(Vec2d origin, Vec2d dimensions, Colour* colour) {
    glPushMatrix();
        glTranslatef(origin.getX(), origin.getY(), 0.f);
    
        glColor3fv(colour->getColour3fv());
    
        glShadeModel(GL_FLAT);
        GLfloat vertices[8] = {
             0                  ,0
            ,dimensions.getX()  ,0
            ,dimensions.getX()  ,dimensions.getY()
            ,0                  ,dimensions.getY()
        };
        glEnableClientState(GL_VERTEX_ARRAY);
        glVertexPointer(2, GL_FLOAT, 0, vertices);
        glLineWidth(4);
        glDrawArrays(GL_LINE_LOOP, 0, 4);
        glDisableClientState(GL_VERTEX_ARRAY);
    glPopMatrix();
}